

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O3

bool __thiscall
bssl::anon_unknown_0::X25519MLKEM768KeyShare::Generate(X25519MLKEM768KeyShare *this,CBB *out)

{
  int iVar1;
  bool bVar2;
  uint8_t x25519_public_key [32];
  uint8_t mlkem_public_key [1184];
  uint8_t auStack_4e8 [32];
  uint8_t local_4c8 [1192];
  
  bVar2 = false;
  MLKEM768_generate_key(local_4c8,(uint8_t *)0x0,&this->mlkem_private_key_);
  X25519_keypair(auStack_4e8,this->x25519_private_key_);
  iVar1 = CBB_add_bytes(out,local_4c8,0x4a0);
  if (iVar1 != 0) {
    iVar1 = CBB_add_bytes(out,auStack_4e8,0x20);
    bVar2 = iVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool Generate(CBB *out) override {
    uint8_t mlkem_public_key[MLKEM768_PUBLIC_KEY_BYTES];
    MLKEM768_generate_key(mlkem_public_key, /*optional_out_seed=*/nullptr,
                          &mlkem_private_key_);

    uint8_t x25519_public_key[X25519_PUBLIC_VALUE_LEN];
    X25519_keypair(x25519_public_key, x25519_private_key_);

    if (!CBB_add_bytes(out, mlkem_public_key, sizeof(mlkem_public_key)) ||
        !CBB_add_bytes(out, x25519_public_key, sizeof(x25519_public_key))) {
      return false;
    }

    return true;
  }